

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

int lws_ssl_capable_write_no_ssl(lws *wsi,uchar *buf,int len)

{
  uint uVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  lws_udp *__addr;
  socklen_t __addr_len;
  uint uVar5;
  uint16_t u16;
  ushort local_1a;
  
  if (wsi->udp == (lws_udp *)0x0) {
    if ((wsi->role_ops->field_0xc8 & 1) == 0) {
      sVar3 = send((wsi->desc).sockfd,buf,(long)len,0x4000);
      uVar5 = (uint)sVar3;
    }
    else {
      sVar3 = write((wsi->desc).sockfd,buf,(long)len);
      uVar5 = (uint)sVar3;
    }
  }
  else if (((wsi->context->udp_loss_sim_tx_pc == '\0') ||
           (sVar2 = lws_get_random(wsi->context,&local_1a,2), sVar2 != 2)) ||
          ((uint)wsi->context->udp_loss_sim_tx_pc < ((uint)local_1a * 100) / 0xffff)) {
    __addr = wsi->udp;
    if (wsi->buflist_out == (lws_buflist *)0x0) {
      __addr_len = __addr->salen;
    }
    else {
      __addr_len = __addr->salen_pending;
      __addr = (lws_udp *)&__addr->sa_pending;
    }
    sVar3 = sendto((wsi->desc).sockfd,buf,(long)len,0,(sockaddr *)__addr,__addr_len);
    uVar5 = (uint)sVar3;
  }
  else {
    _lws_log(2,"%s: dropping udp tx\n","lws_ssl_capable_write_no_ssl");
    uVar5 = len;
  }
  uVar1 = uVar5;
  if ((int)uVar5 < 0) {
    piVar4 = __errno_location();
    uVar1 = 0xfffffffc;
    if ((*piVar4 != 4) && (*piVar4 != 0xb)) {
      _lws_log(0x10,"ERROR writing len %d to skt fd %d err %d / errno %d\n",(ulong)(uint)len,
               (ulong)(uint)(wsi->desc).sockfd,(ulong)uVar5);
      uVar1 = 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

int
lws_ssl_capable_write_no_ssl(struct lws *wsi, unsigned char *buf, int len)
{
	int n = 0;
#if defined(LWS_PLAT_OPTEE)
	ssize_t send(int sockfd, const void *buf, size_t len, int flags);
#endif

#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		if (wsi->context->udp_loss_sim_tx_pc) {
			uint16_t u16;
			/*
			 * We should randomly drop some of these
			 */

			if (lws_get_random(wsi->context, &u16, 2) == 2 &&
			    ((u16 * 100) / 0xffff) <=
				    wsi->context->udp_loss_sim_tx_pc) {
				lwsl_warn("%s: dropping udp tx\n", __func__);
				/* pretend it was sent */
				n = len;
				goto post_send;
			}
		}
		if (lws_has_buffered_out(wsi))
			n = sendto(wsi->desc.sockfd, (const char *)buf,
				   len, 0, &wsi->udp->sa_pending,
				   wsi->udp->salen_pending);
		else
			n = sendto(wsi->desc.sockfd, (const char *)buf,
				   len, 0, &wsi->udp->sa, wsi->udp->salen);
	} else
#endif
		if (wsi->role_ops->file_handle)
			n = write((int)(long long)wsi->desc.filefd, buf, len);
		else
			n = send(wsi->desc.sockfd, (char *)buf, len, MSG_NOSIGNAL);
//	lwsl_info("%s: sent len %d result %d", __func__, len, n);

#if defined(LWS_WITH_UDP)
post_send:
#endif
	if (n >= 0)
		return n;

	if (LWS_ERRNO == LWS_EAGAIN ||
	    LWS_ERRNO == LWS_EWOULDBLOCK ||
	    LWS_ERRNO == LWS_EINTR) {
		if (LWS_ERRNO == LWS_EWOULDBLOCK) {
			lws_set_blocking_send(wsi);
		}

		return LWS_SSL_CAPABLE_MORE_SERVICE;
	}

	lwsl_debug("ERROR writing len %d to skt fd %d err %d / errno %d\n",
		   len, wsi->desc.sockfd, n, LWS_ERRNO);

	return LWS_SSL_CAPABLE_ERROR;
}